

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void boost::xpressive::detail::
     merge_charset<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
               (basic_chset<char> *basic,
               compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               *compound,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  ushort uVar1;
  bool bVar2;
  char_class_type cVar3;
  uint uVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar5;
  basic_chset_8bit<char> *pbVar6;
  const_reference pvVar7;
  cpp_regex_traits<char> *in_RDX;
  compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RSI;
  int i_1;
  char_class_type mask_1;
  size_t j;
  int i;
  char_class_type mask;
  char in_stack_ffffffffffffffbf;
  basic_chset_8bit<char> *in_stack_ffffffffffffffc0;
  int local_38;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffd0;
  basic_chset_8bit<char> *this;
  basic_chset_8bit<char> *__n;
  int local_28;
  
  cVar3 = compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          ::posix_yes(in_RSI);
  if (cVar3 != 0) {
    cVar3 = compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
            ::posix_yes(in_RSI);
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      uVar4 = cpp_regex_traits<char>::isctype(in_RDX,(int)(char)local_28,(uint)cVar3);
      if ((uVar4 & 1) != 0) {
        basic_chset_8bit<char>::set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
      }
    }
  }
  compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  ::posix_no(in_RSI);
  bVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                    (in_stack_ffffffffffffffd0);
  if (!bVar2) {
    this = (basic_chset_8bit<char> *)0x0;
    while( true ) {
      __n = this;
      pvVar5 = compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               ::posix_no(in_RSI);
      pbVar6 = (basic_chset_8bit<char> *)
               std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar5);
      if (pbVar6 <= this) break;
      pvVar5 = compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               ::posix_no(in_RSI);
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (pvVar5,(size_type)__n);
      uVar1 = *pvVar7;
      for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
        uVar4 = cpp_regex_traits<char>::isctype(in_RDX,(int)(char)local_38,(uint)uVar1);
        if ((uVar4 & 1) == 0) {
          basic_chset_8bit<char>::set(this,in_stack_ffffffffffffffbf);
        }
      }
      this = (basic_chset_8bit<char> *)((long)(__n->bset_).super__Base_bitset<4UL>._M_w + 1);
    }
  }
  bVar2 = compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          ::is_inverted(in_RSI);
  if (bVar2) {
    basic_chset_8bit<char>::inverse((basic_chset_8bit<char> *)0x1736db);
  }
  return;
}

Assistant:

inline void merge_charset
(
    basic_chset<Char> &basic
  , compound_charset<Traits> const &compound
  , Traits const &tr
)
{
    detail::ignore_unused(tr);
    if(0 != compound.posix_yes())
    {
        typename Traits::char_class_type mask = compound.posix_yes();
        for(int i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
        {
            if(tr.isctype((Char)i, mask))
            {
                basic.set((Char)i);
            }
        }
    }

    if(!compound.posix_no().empty())
    {
        for(std::size_t j = 0; j < compound.posix_no().size(); ++j)
        {
            typename Traits::char_class_type mask = compound.posix_no()[j];
            for(int i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                if(!tr.isctype((Char)i, mask))
                {
                    basic.set((Char)i);
                }
            }
        }
    }

    if(compound.is_inverted())
    {
        basic.inverse();
    }
}